

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t50(void)

{
  int iVar1;
  long lVar2;
  char *__s2;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  uint16_t truncated [8];
  uint16_t utf16_ref [23];
  uint16_t little [8];
  size_t s;
  uint16_t *utf16;
  char utf8 [29];
  ALLEGRO_USTR *us;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  size_t local_38;
  void *local_30;
  char local_28 [32];
  undefined8 local_8;
  
  builtin_strncpy(local_28,"⅛-note: 𝅘𝅥𝅮, domino: 🁡",0x1d);
  memcpy(local_78,&DAT_0010fec0,0x2e);
  local_88 = 0x6f006e002d215b;
  local_80 = 0x3a00650074;
  local_8 = al_ustr_new_from_utf16(local_78);
  lVar2 = al_ustr_length(local_8);
  if (lVar2 == 0x14) {
    log_printf("OK   %s\n","20 == al_ustr_length(us)");
  }
  else {
    log_printf("FAIL %s\n","20 == al_ustr_length(us)");
    error = error + 1;
  }
  __s2 = (char *)al_cstr(local_8);
  iVar1 = strcmp(local_28,__s2);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == strcmp(utf8, al_cstr(us))");
  }
  else {
    log_printf("FAIL %s\n","0 == strcmp(utf8, al_cstr(us))");
    error = error + 1;
  }
  al_ustr_free(local_8);
  local_8 = al_ustr_new(local_28);
  local_38 = al_ustr_size_utf16(local_8);
  if (local_38 == 0x2e) {
    log_printf("OK   %s\n","46 == s");
  }
  else {
    log_printf("FAIL %s\n","46 == s");
    error = error + 1;
  }
  local_30 = malloc(local_38);
  al_ustr_encode_utf16(local_8,local_30,local_38);
  iVar1 = memcmp(local_30,local_78,local_38);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(utf16, utf16_ref, s)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(utf16, utf16_ref, s)");
    error = error + 1;
  }
  free(local_30);
  local_38 = al_ustr_encode_utf16(local_8,local_48,0x10);
  if (local_38 == 0x10) {
    log_printf("OK   %s\n","16 == s");
  }
  else {
    log_printf("FAIL %s\n","16 == s");
    error = error + 1;
  }
  iVar1 = memcmp(&local_88,local_48,local_38);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(truncated, little, s)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(truncated, little, s)");
    error = error + 1;
  }
  al_ustr_free(local_8);
  return;
}

Assistant:

static void t50(void)
{
   ALLEGRO_USTR *us;
   char utf8[] = "⅛-note: 𝅘𝅥𝅮, domino: 🁡";
   uint16_t *utf16;
   size_t s;
   uint16_t little[8];
   /* Only native byte order supported right now, so have to specify
    * elements as uint16_t and not as char.
    */
   uint16_t utf16_ref[] = {
      0x215b, 0x002d, 0x006e, 0x006f, 0x0074,
      0x0065, 0x003a, 0x0020, 0xd834, 0xdd60,
      0x002c, 0x0020, 0x0064, 0x006f, 0x006d,
      0x0069, 0x006e, 0x006f, 0x003a, 0x0020,
      0xd83c, 0xdc61, 0x0000};
   uint16_t truncated[] = {
      0x215b, 0x002d, 0x006e, 0x006f, 0x0074,
      0x0065, 0x003a, 0x0000};

   us = al_ustr_new_from_utf16(utf16_ref);
   CHECK(20 == al_ustr_length(us));
   CHECK(0 == strcmp(utf8, al_cstr(us)));
   al_ustr_free(us);

   us = al_ustr_new(utf8);
   s = al_ustr_size_utf16(us);
   CHECK(46 == s);
   utf16 = malloc(s);
   al_ustr_encode_utf16(us, utf16, s);
   CHECK(0 == memcmp(utf16, utf16_ref, s));
   free(utf16);
   
   s = al_ustr_encode_utf16(us, little, sizeof little);
   CHECK(16 == s);
   CHECK(0 == memcmp(truncated, little, s));
   al_ustr_free(us);
}